

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O1

void BM_Check1(int n)

{
  string *psVar1;
  int iVar2;
  CheckOpString local_90;
  LogMessage local_88;
  
  do {
    if (n < 1) {
      return;
    }
    iVar2 = n + -1;
    local_90.str_ = (string *)(CONCAT44(local_90.str_._4_4_,x - 1) | 5);
    local_88.allocated_._0_4_ = iVar2;
    if ((int)(x - 1 | 5) < n) {
      psVar1 = (string *)0x0;
    }
    else {
      psVar1 = google::MakeCheckOpString<int,int>((int *)&local_88,(int *)&local_90,"n >= x");
    }
    if (psVar1 != (string *)0x0) {
      local_90.str_ = psVar1;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_88,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x7d,&local_90);
      google::LogMessage::stream(&local_88);
      goto LAB_0010a980;
    }
    local_90.str_ = (string *)(CONCAT44(local_90.str_._4_4_,x - 1) | 5);
    if ((int)(x - 1 | 5) < n) {
      psVar1 = (string *)0x0;
      local_88.allocated_._0_4_ = iVar2;
    }
    else {
      local_88.allocated_._0_4_ = iVar2;
      psVar1 = google::MakeCheckOpString<int,int>((int *)&local_88,(int *)&local_90,"n >= x");
    }
    if (psVar1 != (string *)0x0) {
      local_90.str_ = psVar1;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_88,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x7e,&local_90);
      google::LogMessage::stream(&local_88);
      goto LAB_0010a980;
    }
    local_88.allocated_._0_4_ = n + -1;
    local_90.str_ = (string *)(CONCAT44(local_90.str_._4_4_,x - 1) | 5);
    if ((int)(x - 1 | 5) < n) {
      psVar1 = (string *)0x0;
    }
    else {
      psVar1 = google::MakeCheckOpString<int,int>((int *)&local_88,(int *)&local_90,"n >= x");
    }
    if (psVar1 != (string *)0x0) {
      local_90.str_ = psVar1;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_88,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x7f,&local_90);
      google::LogMessage::stream(&local_88);
      goto LAB_0010a980;
    }
    local_88.allocated_._0_4_ = n + -1;
    local_90.str_ = (string *)(CONCAT44(local_90.str_._4_4_,x - 1) | 5);
    if ((int)(x - 1 | 5) < n) {
      psVar1 = (string *)0x0;
    }
    else {
      psVar1 = google::MakeCheckOpString<int,int>((int *)&local_88,(int *)&local_90,"n >= x");
    }
    if (psVar1 != (string *)0x0) {
      local_90.str_ = psVar1;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_88,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x80,&local_90);
      google::LogMessage::stream(&local_88);
      goto LAB_0010a980;
    }
    local_88.allocated_._0_4_ = n + -1;
    local_90.str_ = (string *)(CONCAT44(local_90.str_._4_4_,x - 1) | 5);
    if ((int)(x - 1 | 5) < n) {
      psVar1 = (string *)0x0;
    }
    else {
      psVar1 = google::MakeCheckOpString<int,int>((int *)&local_88,(int *)&local_90,"n >= x");
    }
    if (psVar1 != (string *)0x0) {
      local_90.str_ = psVar1;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_88,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x81,&local_90);
      google::LogMessage::stream(&local_88);
      goto LAB_0010a980;
    }
    local_88.allocated_._0_4_ = n + -1;
    local_90.str_ = (string *)(CONCAT44(local_90.str_._4_4_,x - 1) | 5);
    if ((int)(x - 1 | 5) < n) {
      psVar1 = (string *)0x0;
    }
    else {
      psVar1 = google::MakeCheckOpString<int,int>((int *)&local_88,(int *)&local_90,"n >= x");
    }
    if (psVar1 != (string *)0x0) {
      local_90.str_ = psVar1;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_88,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x82,&local_90);
      google::LogMessage::stream(&local_88);
      goto LAB_0010a980;
    }
    local_88.allocated_._0_4_ = n + -1;
    local_90.str_ = (string *)(CONCAT44(local_90.str_._4_4_,x - 1) | 5);
    if ((int)(x - 1 | 5) < n) {
      psVar1 = (string *)0x0;
    }
    else {
      psVar1 = google::MakeCheckOpString<int,int>((int *)&local_88,(int *)&local_90,"n >= x");
    }
    if (psVar1 != (string *)0x0) {
      local_90.str_ = psVar1;
      google::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_88,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
                 ,0x83,&local_90);
      google::LogMessage::stream(&local_88);
      goto LAB_0010a980;
    }
    local_88.allocated_._0_4_ = n + -1;
    local_90.str_ = (string *)(CONCAT44(local_90.str_._4_4_,x - 1) | 5);
    if ((int)(x - 1 | 5) < n) {
      psVar1 = (string *)0x0;
    }
    else {
      psVar1 = google::MakeCheckOpString<int,int>((int *)&local_88,(int *)&local_90,"n >= x");
    }
    n = n + -1;
  } while (psVar1 == (string *)0x0);
  local_90.str_ = psVar1;
  google::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging_unittest.cc"
             ,0x84,&local_90);
  google::LogMessage::stream(&local_88);
LAB_0010a980:
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_88);
}

Assistant:

static void BM_Check1(int n) {
  while (n-- > 0) {
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
    CHECK_GE(n, x);
  }
}